

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O0

string * __thiscall
IRC_Bot::getTriggers_abi_cxx11_
          (string *__return_storage_ptr__,IRC_Bot *this,
          vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> *commands)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  reference local_40;
  IRCCommand **command;
  iterator __end1;
  iterator __begin1;
  vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> *__range1;
  vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> *commands_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>::begin
                     ((vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> *)this);
  command = (IRCCommand **)
            std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>::end
                      ((vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> *)this);
  while (bVar1 = __gnu_cxx::
                 operator==<IRCCommand_**,_std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>_>
                           (&__end1,(__normal_iterator<IRCCommand_**,_std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>_>
                                     *)&command), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_40 = __gnu_cxx::
               __normal_iterator<IRCCommand_**,_std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>_>
               ::operator*(&__end1);
    bVar2 = (basic_string_view<char,_std::char_traits<char>_>)
            Jupiter::Command::getTrigger((ulong)*local_40);
    local_50 = bVar2;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_50);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,' ');
    __gnu_cxx::
    __normal_iterator<IRCCommand_**,_std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IRC_Bot::getTriggers(std::vector<IRCCommand*> &commands) {
	std::string result;
	for (const auto& command : commands) {
		result += command->getTrigger();
		result += ' ';
	}

	return result;
}